

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# log.c
# Opt level: O1

char * log_medium_to_str(LOG_MEDIUM medium)

{
  if (medium < (LOG_MEDIUM_EVENTLOG|LOG_MEDIUM_STDOUT)) {
    return &DAT_001093d4 + *(int *)(&DAT_001093d4 + (ulong)medium * 4);
  }
  return "Unknown Medium";
}

Assistant:

const char *log_medium_to_str(enum LOG_MEDIUM medium)
{
	switch (medium) {
	case LOG_MEDIUM_NONE:
		return "Void";
	case LOG_MEDIUM_STDOUT:
		return "Console";
	case LOG_MEDIUM_FILE:
		return "Log File";
	case LOG_MEDIUM_SYSLOG:
		return "Syslog";
	case LOG_MEDIUM_EVENTLOG:
		return "Event Log";
	default:
		return "Unknown Medium";
	}
}